

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadDsd.c
# Opt level: O3

Abc_Obj_t * Io_ReadDsd_rec(Abc_Ntk_t *pNtk,char *pCur,char *pSop)

{
  char cVar1;
  uint nVars;
  Abc_Obj_t *pAVar2;
  size_t sVar3;
  Abc_Obj_t *pAVar4;
  char *pSop_00;
  byte bVar5;
  ulong uVar6;
  char *pcVar7;
  int TypeExor;
  char *pParts [32];
  int local_13c;
  char *local_138 [33];
  
  cVar1 = *pCur;
  if (cVar1 != '(') {
    if (cVar1 == '!') {
      pAVar2 = Io_ReadDsd_rec(pNtk,pCur + 1,(char *)0x0);
      pAVar2 = Abc_NtkCreateNodeInv(pNtk,pAVar2);
      return pAVar2;
    }
    bVar5 = cVar1 + 0x9f;
    if (0x19 < bVar5) {
      pcVar7 = pCur;
      if ((byte)(cVar1 - 0x30U) < 10 || (byte)(cVar1 + 0xbfU) < 6) {
        do {
          cVar1 = pcVar7[1];
          pcVar7 = pcVar7 + 1;
        } while ((byte)(cVar1 + 0xbfU) < 6 || (byte)(cVar1 - 0x30U) < 10);
      }
      if (cVar1 != '(') {
        puts("Cannot find the end of hexidecimal truth table.");
        return (Abc_Obj_t *)0x0;
      }
      *pcVar7 = '\0';
      pSop_00 = Abc_SopFromTruthHex(pCur);
      *pcVar7 = '(';
      pAVar2 = Io_ReadDsd_rec(pNtk,pcVar7,pSop_00);
      if (pSop_00 != (char *)0x0) {
        free(pSop_00);
        return pAVar2;
      }
      return pAVar2;
    }
    if (pCur[1] != '\0') {
      __assert_fail("*(pCur+1) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadDsd.c"
                    ,0xc6,"Abc_Obj_t *Io_ReadDsd_rec(Abc_Ntk_t *, char *, char *)");
    }
    if (pNtk->vPis->nSize <= (int)(uint)bVar5) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    return (Abc_Obj_t *)pNtk->vPis->pArray[(uint)bVar5];
  }
  sVar3 = strlen(pCur);
  if (pCur[sVar3 - 1] != ')') {
    __assert_fail("pCur[strlen(pCur)-1] == \')\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadDsd.c"
                  ,0x9e,"Abc_Obj_t *Io_ReadDsd_rec(Abc_Ntk_t *, char *, char *)");
  }
  pCur[sVar3 - 1] = '\0';
  nVars = Io_ReadDsdStrSplit(pCur + 1,local_138,&local_13c);
  if (nVars == 0) {
    Abc_NtkDelete(pNtk);
    return (Abc_Obj_t *)0x0;
  }
  pAVar2 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
  if (pSop == (char *)0x0) {
    if (0 < (int)nVars) {
      uVar6 = 0;
      do {
        pAVar4 = Io_ReadDsd_rec(pNtk,local_138[uVar6],(char *)0x0);
        if (pAVar4 == (Abc_Obj_t *)0x0) {
          return (Abc_Obj_t *)0x0;
        }
        Abc_ObjAddFanin(pAVar2,pAVar4);
        uVar6 = uVar6 + 1;
      } while (nVars != uVar6);
      goto LAB_00331bb6;
    }
LAB_00331bd0:
    if (local_13c == 0) {
      pcVar7 = Abc_SopCreateAnd((Mem_Flex_t *)pNtk->pManFunc,nVars,(int *)0x0);
    }
    else {
      pcVar7 = Abc_SopCreateXorSpecial((Mem_Flex_t *)pNtk->pManFunc,nVars);
    }
  }
  else {
    if (0 < (int)nVars) {
      uVar6 = 0;
      do {
        pAVar4 = Io_ReadDsd_rec(pNtk,local_138[uVar6],(char *)0x0);
        if (pAVar4 == (Abc_Obj_t *)0x0) {
          return (Abc_Obj_t *)0x0;
        }
        Abc_ObjAddFanin(pAVar2,pAVar4);
        uVar6 = uVar6 + 1;
      } while (nVars != uVar6);
LAB_00331bb6:
      if (pSop == (char *)0x0) goto LAB_00331bd0;
    }
    pcVar7 = Abc_SopRegister((Mem_Flex_t *)pNtk->pManFunc,pSop);
  }
  (pAVar2->field_5).pData = pcVar7;
  return pAVar2;
}

Assistant:

Abc_Obj_t * Io_ReadDsd_rec( Abc_Ntk_t * pNtk, char * pCur, char * pSop )
{
    Abc_Obj_t * pObj, * pFanin;
    char * pEnd, * pParts[32];
    int i, nParts, TypeExor;

    // consider complemented formula
    if ( *pCur == '!' )
    {
        pObj = Io_ReadDsd_rec( pNtk, pCur + 1, NULL );
        return Abc_NtkCreateNodeInv( pNtk, pObj );
    }
    if ( *pCur == '(' )
    {
        assert( pCur[strlen(pCur)-1] == ')' );
        pCur[strlen(pCur)-1] = 0;
        nParts = Io_ReadDsdStrSplit( pCur+1, pParts, &TypeExor );
        if ( nParts == 0 )
        {
            Abc_NtkDelete( pNtk );
            return NULL;
        }
        pObj = Abc_NtkCreateNode( pNtk );
        if ( pSop )
        {
//            for ( i = nParts - 1; i >= 0; i-- )
            for ( i = 0; i < nParts; i++ )
            {
                pFanin = Io_ReadDsd_rec( pNtk, pParts[i], NULL );
                if ( pFanin == NULL )
                    return NULL;
                Abc_ObjAddFanin( pObj, pFanin );
            }
        }
        else
        {
            for ( i = 0; i < nParts; i++ )
            {
                pFanin = Io_ReadDsd_rec( pNtk, pParts[i], NULL );
                if ( pFanin == NULL )
                    return NULL;
                Abc_ObjAddFanin( pObj, pFanin );
            }
        }
        if ( pSop )
            pObj->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, pSop );
        else if ( TypeExor )
            pObj->pData = Abc_SopCreateXorSpecial( (Mem_Flex_t *)pNtk->pManFunc, nParts );
        else
            pObj->pData = Abc_SopCreateAnd( (Mem_Flex_t *)pNtk->pManFunc, nParts, NULL );
        return pObj;
    }
    if ( *pCur >= 'a' && *pCur <= 'z' )
    {
        assert( *(pCur+1) == 0 );
        return Abc_NtkPi( pNtk, *pCur - 'a' );
    }

    // skip hex truth table
    pEnd = pCur;
    while ( (*pEnd >= '0' && *pEnd <= '9') || (*pEnd >= 'A' && *pEnd <= 'F') )
        pEnd++;
    if ( *pEnd != '(' )
    {
        printf( "Cannot find the end of hexidecimal truth table.\n" );
        return NULL;
    }

    // parse the truth table
    *pEnd = 0;
    pSop = Abc_SopFromTruthHex( pCur );
    *pEnd = '(';
    pObj = Io_ReadDsd_rec( pNtk, pEnd, pSop );
    ABC_FREE( pSop );
    return pObj;
}